

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O2

REF_STATUS
ref_metric_belme_gfe
          (REF_DBL *metric,REF_GRID ref_grid,REF_INT ldim,REF_DBL *prim_dual,
          REF_RECON_RECONSTRUCTION reconstruction)

{
  double dVar1;
  REF_NODE pRVar2;
  uint uVar3;
  REF_DBL *scalar;
  ulong uVar4;
  REF_DBL *grad;
  REF_DBL *scalar_00;
  REF_DBL *hessian;
  long lVar5;
  long lVar6;
  ulong uVar7;
  REF_DBL *pRVar8;
  undefined8 uVar9;
  REF_STATUS RVar10;
  REF_DBL *pRVar11;
  long lVar12;
  char *pcVar13;
  long lVar14;
  REF_DBL *local_d8;
  REF_DBL local_a8 [4];
  REF_DBL node_flux [5];
  REF_DBL state [5];
  
  pRVar2 = ref_grid->node;
  uVar3 = pRVar2->max;
  uVar7 = (ulong)uVar3;
  if ((int)uVar3 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0xa87,
           "ref_metric_belme_gfe","malloc lam of REF_DBL negative");
    RVar10 = 1;
  }
  else {
    scalar = (REF_DBL *)malloc(uVar7 * 8);
    RVar10 = 2;
    if (scalar == (REF_DBL *)0x0) {
      pcVar13 = "malloc lam of REF_DBL NULL";
      uVar9 = 0xa87;
    }
    else {
      for (uVar4 = 0; uVar7 != uVar4; uVar4 = uVar4 + 1) {
        scalar[uVar4] = 0.0;
      }
      grad = (REF_DBL *)malloc(uVar7 * 0x18);
      if (grad == (REF_DBL *)0x0) {
        pcVar13 = "malloc grad_lam of REF_DBL NULL";
        uVar9 = 0xa88;
      }
      else {
        for (uVar4 = 0; (uVar7 * 3 & 0xffffffff) != uVar4; uVar4 = uVar4 + 1) {
          grad[uVar4] = 0.0;
        }
        scalar_00 = (REF_DBL *)malloc(uVar7 * 8);
        if (scalar_00 == (REF_DBL *)0x0) {
          pcVar13 = "malloc flux of REF_DBL NULL";
          uVar9 = 0xa89;
        }
        else {
          for (uVar4 = 0; uVar7 != uVar4; uVar4 = uVar4 + 1) {
            scalar_00[uVar4] = 0.0;
          }
          hessian = (REF_DBL *)malloc((ulong)(uVar3 * 6) * 8);
          if (hessian != (REF_DBL *)0x0) {
            for (uVar7 = 0; uVar3 * 6 != uVar7; uVar7 = uVar7 + 1) {
              hessian[uVar7] = 0.0;
            }
            local_d8 = prim_dual + ldim / 2;
            lVar6 = 0;
            do {
              if (lVar6 == 5) {
                lVar6 = 0;
                while( true ) {
                  if (pRVar2->max <= lVar6) {
                    free(hessian);
                    free(scalar_00);
                    free(grad);
                    free(scalar);
                    return 0;
                  }
                  if ((-1 < pRVar2->global[lVar6]) &&
                     (uVar3 = ref_matrix_healthy_m(metric), uVar3 != 0)) break;
                  lVar6 = lVar6 + 1;
                  metric = metric + 6;
                }
                uVar7 = (ulong)uVar3;
                pcVar13 = "euler-opt-goal";
                uVar9 = 0xaab;
LAB_00191d8c:
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                       ,uVar9,"ref_metric_belme_gfe",uVar7,pcVar13);
                return (REF_STATUS)uVar7;
              }
              uVar7 = (ulong)(uint)pRVar2->max;
              if (pRVar2->max < 1) {
                uVar7 = 0;
              }
              pRVar8 = local_d8;
              for (uVar4 = 0; uVar7 != uVar4; uVar4 = uVar4 + 1) {
                if (-1 < pRVar2->global[uVar4]) {
                  scalar[uVar4] = *pRVar8;
                }
                pRVar8 = pRVar8 + ldim;
              }
              uVar3 = ref_recon_gradient(ref_grid,scalar,grad,reconstruction);
              if (uVar3 != 0) {
                uVar7 = (ulong)uVar3;
                pcVar13 = "grad_lam";
                uVar9 = 0xa93;
                goto LAB_00191d8c;
              }
              for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
                pRVar8 = prim_dual;
                for (lVar14 = 0; lVar14 < pRVar2->max; lVar14 = lVar14 + 1) {
                  if (-1 < pRVar2->global[lVar14]) {
                    local_a8[2] = 0.0;
                    local_a8[0] = 0.0;
                    local_a8[1] = 0.0;
                    local_a8[lVar12] = 1.0;
                    for (lVar5 = 0; lVar5 != 5; lVar5 = lVar5 + 1) {
                      state[lVar5] = pRVar8[lVar5];
                    }
                    uVar3 = ref_phys_euler(state,local_a8,node_flux);
                    if (uVar3 != 0) {
                      uVar7 = (ulong)uVar3;
                      pcVar13 = "euler";
                      uVar9 = 0xa9d;
                      goto LAB_00191d8c;
                    }
                    scalar_00[lVar14] = node_flux[lVar6];
                  }
                  pRVar8 = pRVar8 + ldim;
                }
                uVar3 = ref_recon_hessian(ref_grid,scalar_00,hessian,reconstruction);
                if (uVar3 != 0) {
                  uVar7 = (ulong)uVar3;
                  pcVar13 = "hess";
                  uVar9 = 0xaa0;
                  goto LAB_00191d8c;
                }
                uVar7 = (ulong)(uint)pRVar2->max;
                if (pRVar2->max < 1) {
                  uVar7 = 0;
                }
                pRVar8 = hessian;
                pRVar11 = metric;
                for (uVar4 = 0; uVar4 != uVar7; uVar4 = uVar4 + 1) {
                  if (-1 < pRVar2->global[uVar4]) {
                    dVar1 = grad[lVar12 + uVar4 * 3];
                    if (dVar1 <= -dVar1) {
                      dVar1 = -dVar1;
                    }
                    for (lVar14 = 0; lVar14 != 6; lVar14 = lVar14 + 1) {
                      pRVar11[lVar14] = pRVar8[lVar14] * dVar1 + pRVar11[lVar14];
                    }
                  }
                  pRVar11 = pRVar11 + 6;
                  pRVar8 = pRVar8 + 6;
                }
              }
              lVar6 = lVar6 + 1;
              local_d8 = local_d8 + 1;
            } while( true );
          }
          pcVar13 = "malloc hess_flux of REF_DBL NULL";
          uVar9 = 0xa8a;
        }
      }
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",uVar9,
           "ref_metric_belme_gfe",pcVar13);
  }
  return RVar10;
}

Assistant:

REF_FCN REF_STATUS ref_metric_belme_gfe(
    REF_DBL *metric, REF_GRID ref_grid, REF_INT ldim, REF_DBL *prim_dual,
    REF_RECON_RECONSTRUCTION reconstruction) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT var, dir, node, i;
  REF_INT nequ;
  REF_DBL state[5], node_flux[5], direction[3];
  REF_DBL *lam, *grad_lam, *flux, *hess_flux;
  ref_malloc_init(lam, ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(grad_lam, 3 * ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(flux, ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(hess_flux, 6 * ref_node_max(ref_node), REF_DBL, 0.0);

  nequ = ldim / 2;

  for (var = 0; var < 5; var++) {
    each_ref_node_valid_node(ref_node, node) {
      lam[node] = prim_dual[var + 1 * nequ + ldim * node];
    }
    RSS(ref_recon_gradient(ref_grid, lam, grad_lam, reconstruction),
        "grad_lam");
    for (dir = 0; dir < 3; dir++) {
      each_ref_node_valid_node(ref_node, node) {
        direction[0] = 0.0;
        direction[1] = 0.0;
        direction[2] = 0.0;
        direction[dir] = 1.0;
        for (i = 0; i < 5; i++) {
          state[i] = prim_dual[i + 0 * nequ + ldim * node];
        }
        RSS(ref_phys_euler(state, direction, node_flux), "euler");
        flux[node] = node_flux[var];
      }
      RSS(ref_recon_hessian(ref_grid, flux, hess_flux, reconstruction), "hess");
      each_ref_node_valid_node(ref_node, node) {
        for (i = 0; i < 6; i++) {
          metric[i + 6 * node] +=
              ABS(grad_lam[dir + 3 * node]) * hess_flux[i + 6 * node];
        }
      }
    }
  }

  each_ref_node_valid_node(ref_node, node) {
    RSS(ref_matrix_healthy_m(&(metric[6 * node])), "euler-opt-goal");
  }

  ref_free(hess_flux);
  ref_free(flux);
  ref_free(grad_lam);
  ref_free(lam);

  return REF_SUCCESS;
}